

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::set_common_uniforms(Fluid *this,Program *program)

{
  PFNGLUNIFORM2IVPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  Program *pPVar4;
  GLint GVar5;
  float *pfVar6;
  int *piVar7;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Program *local_18;
  Program *program_local;
  Fluid *this_local;
  
  p_Var2 = glad_glUniform3fv;
  local_18 = program;
  program_local = (Program *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"bounds_min",&local_39);
  GVar5 = gfx::Program::uniform_loc(program,&local_38);
  pfVar6 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_min);
  (*p_Var2)(GVar5,1,pfVar6);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pPVar4 = local_18;
  p_Var2 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"bounds_max",&local_71);
  GVar5 = gfx::Program::uniform_loc(pPVar4,&local_70);
  pfVar6 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_max);
  (*p_Var2)(GVar5,1,pfVar6);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pPVar4 = local_18;
  p_Var3 = glad_glUniform3iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"grid_dim",&local_99);
  GVar5 = gfx::Program::uniform_loc(pPVar4,&local_98);
  piVar7 = glm::value_ptr<int,(glm::qualifier)0>(&this->grid_dimensions);
  (*p_Var3)(GVar5,1,piVar7);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pPVar4 = local_18;
  p_Var1 = glad_glUniform2iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"resolution",&local_c1);
  GVar5 = gfx::Program::uniform_loc(pPVar4,&local_c0);
  piVar7 = glm::value_ptr<int,(glm::qualifier)0>(&this->resolution);
  (*p_Var1)(GVar5,1,piVar7);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  return;
}

Assistant:

void set_common_uniforms(gfx::Program& program) {
        glUniform3fv(program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniform2iv(program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
    }